

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioWaveTxAt(void)

{
  uint32_t uVar1;
  dmaOPage_t **ppdVar2;
  rawWaveInfo_t *prVar3;
  int iVar4;
  long lVar5;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveTxAt_cold_1();
  }
  if (libInitialised == '\0') {
    iVar4 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioWaveTxAt_cold_2();
    }
  }
  else {
    uVar1 = dmaOut[1];
    iVar4 = -9999;
    if (uVar1 != 0) {
      lVar5 = 0;
      ppdVar2 = dmaOBus;
      do {
        if (uVar1 - (int)*ppdVar2 < 0xec0) {
          iVar4 = (uVar1 - (int)*ppdVar2 >> 5) - (int)lVar5;
          goto LAB_0011b70f;
        }
        lVar5 = lVar5 + -0x76;
        ppdVar2 = ppdVar2 + 1;
      } while (lVar5 != -0x622e);
      uVar1 = dmaOut[1];
      if (uVar1 != 0) {
        lVar5 = 0;
        ppdVar2 = dmaOBus;
        do {
          if (uVar1 - (int)*ppdVar2 < 0xec0) {
            iVar4 = (uVar1 - (int)*ppdVar2 >> 5) - (int)lVar5;
            goto LAB_0011b70f;
          }
          lVar5 = lVar5 + -0x76;
          ppdVar2 = ppdVar2 + 1;
        } while (lVar5 != -0x622e);
        iVar4 = -0x270e;
      }
    }
LAB_0011b70f:
    if (iVar4 < 0) {
      iVar4 = -iVar4;
    }
    else {
      prVar3 = waveInfo;
      lVar5 = 0;
      do {
        if (((prVar3->deleted == 0) && ((int)(uint)prVar3->botCB <= iVar4)) &&
           (iVar4 <= (int)(uint)prVar3->topCB)) {
          return (int)lVar5;
        }
        lVar5 = lVar5 + 1;
        prVar3 = prVar3 + 1;
      } while (lVar5 != 0xfa);
      iVar4 = 0x270e;
    }
  }
  return iVar4;
}

Assistant:

int gpioWaveTxAt(void)
{
   int i, cb;

   DBG(DBG_USER, "");

   CHECK_INITED;

   cb = dmaNowAtOCB();

   if (cb < 0) return -cb;

   for (i=0; i<PI_MAX_WAVES; i++)
   {
      if ( !waveInfo[i].deleted &&
          (cb >= waveInfo[i].botCB) &&
          (cb <= waveInfo[i].topCB) ) return i;
   }

   return PI_WAVE_NOT_FOUND;
}